

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

void add_format_to_iofile
               (FMContext fmc,FMFormat_conflict format,int id_size,void *id_buffer,int index)

{
  FMFormat_conflict *pp_Var1;
  FMFormat_conflict p_Var2;
  uint uVar3;
  int iVar4;
  char *__dest;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  iVar4 = get_format_server_verbose();
  if (iVar4 != 0) {
    printf("Entering format %s (%p) into context %p ",format->format_name,format);
    print_server_ID((uchar *)id_buffer);
  }
  for (lVar8 = 0;
      (pp_Var1 = format->subformats, pp_Var1 != (FMFormat_conflict *)0x0 &&
      (pp_Var1[lVar8] != (FMFormat_conflict)0x0)); lVar8 = lVar8 + 1) {
    pp_Var1[lVar8]->subformats = pp_Var1;
  }
  if (id_size != 0) {
    (format->server_ID).length = id_size;
    __dest = (char *)ffs_malloc((long)id_size);
    (format->server_ID).value = __dest;
    memcpy(__dest,id_buffer,(long)id_size);
  }
  fill_derived_format_values(fmc,format);
  for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
    fill_derived_format_values(fmc,format->subformats[lVar7]);
  }
  if (fmc->reg_format_count == fmc->format_list_size) {
    expand_FMContext(fmc);
  }
  if (index == -1) {
    index = fmc->reg_format_count;
    fmc->reg_format_count = index + 1;
    lVar7 = (long)index;
  }
  else {
    lVar7 = (long)index;
    if (fmc->format_list[lVar7] != (FMFormat_conflict)0x0) {
      free_FMformat(fmc->format_list[lVar7]);
    }
    if (fmc->reg_format_count < index) {
      printf("Internal error. skipped format ids format %s.\n",format->format_name);
      return;
    }
    if (fmc->reg_format_count == index) {
      fmc->reg_format_count = index + 1;
    }
  }
  fmc->format_list[lVar7] = format;
  format->format_index = index;
  topo_order_subformats(format,(int)lVar8);
  for (iVar4 = 0; (int)lVar8 != iVar4; iVar4 = iVar4 + 1) {
    pp_Var1 = format->subformats;
    for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 1) {
      p_Var2 = pp_Var1[lVar7];
      uVar3 = p_Var2->field_count;
      if (p_Var2->field_count < 1) {
        uVar3 = 0;
      }
      for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
        if (p_Var2->field_subformats[uVar6] != (FMFormat_conflict)0x0) {
          p_Var2->variant = p_Var2->variant | p_Var2->field_subformats[uVar6]->variant;
        }
      }
    }
  }
  uVar5 = 0;
  uVar6 = (ulong)(uint)format->field_count;
  if (format->field_count < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    if (format->field_subformats[uVar5] != (FMFormat_conflict)0x0) {
      format->variant = format->variant | format->field_subformats[uVar5]->variant;
    }
  }
  return;
}

Assistant:

extern void
add_format_to_iofile(FMContext fmc, FMFormat format, int id_size,
		     void *id_buffer, int index)
{
    int subformat_count = 0;
    int i, field;

    if (get_format_server_verbose()) {
	printf("Entering format %s (%p) into context %p ", 
	       format->format_name, format,
	       fmc);
	print_server_ID(id_buffer);
    }
    while (format->subformats && format->subformats[subformat_count]) {
	format->subformats[subformat_count]->subformats = format->subformats;
	subformat_count++;
    }
    if (id_size) {
	format->server_ID.length = id_size;
	format->server_ID.value = malloc(id_size);
	memcpy(format->server_ID.value, id_buffer, id_size);
    }

    fill_derived_format_values(fmc, format);
    for (i=0; i < subformat_count; i++) {
	fill_derived_format_values(fmc, format->subformats[i]);
    }	
    if (fmc->reg_format_count == fmc->format_list_size) {
	expand_FMContext(fmc);
    }
    if (index == -1) {
	index = fmc->reg_format_count++;
    } else {
 	if (fmc->format_list[index] != NULL) {
  	    free_FMformat(fmc->format_list[index]);
  	}
  	if (index > fmc->reg_format_count) {
  	    printf("Internal error. skipped format ids format %s.\n", 
		   format->format_name);
	    return;
  	}
  	if (index == fmc->reg_format_count) {
 	    /* new format came in */
  	    fmc->reg_format_count++;
  	}
    }
    fmc->format_list[index] = format;
    format->format_index = index;
    topo_order_subformats(format, subformat_count);
    /* bubble up the variant flags */
    for (i= 0; i < subformat_count; i++) {
	int j;
	for (j= 0; j < subformat_count; j++) {
	    FMFormat iof = format->subformats[j];
	    for (field = 0; field < iof->field_count; field++) {
		FMFormat subformat = iof->field_subformats[field];
		if (subformat != NULL) {
		    iof->variant |= subformat->variant;
		}
	    }
	}
    }
    for (field = 0; field < format->field_count; field++) {
	FMFormat subformat = format->field_subformats[field];
	if (subformat != NULL) {
	    format->variant |= subformat->variant;
	}
    }
}